

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

SegmentAnd<capnp::word_*>
capnp::_::WireHelpers::setStructPointer
          (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *ref,StructReader value,
          BuilderArena *orphanArena,bool canonical)

{
  SegmentAnd<capnp::word_*> SVar1;
  bool bVar2;
  WordCount WVar3;
  WirePointer *pWVar4;
  uchar *a;
  ptrdiff_t pVar5;
  word *to;
  unsigned_short *puVar6;
  bool local_f1;
  Iterator local_a8;
  Iterator local_a6;
  Range<unsigned_short> RStack_a4;
  unsigned_short i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_short> *__range2;
  WirePointer *pointerSection;
  word *ptr;
  uint totalSize;
  WordCount dataWords;
  WirePointer *ptr_1;
  uchar *end;
  ArrayPtr<const_unsigned_char> data;
  Fault local_50;
  Fault f;
  ByteCount local_40;
  StructPointerCount ptrCount;
  ByteCount dataSize;
  bool canonical_local;
  BuilderArena *orphanArena_local;
  WirePointer *ref_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder *segment_local;
  
  orphanArena_local = (BuilderArena *)ref;
  ref_local = (WirePointer *)capTable;
  capTable_local = (CapTableBuilder *)segment;
  local_40 = roundBitsUpToBytes(value.dataSize);
  f.exception._6_2_ = value.pointerCount;
  if (canonical) {
    if (value.dataSize != 1 && (value.dataSize & 7) != 0) {
      kj::_::Debug::Fault::Fault
                (&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x6d5,FAILED,
                 "(value.dataSize == ONE * BITS) || (value.dataSize % BITS_PER_BYTE == ZERO * BITS)"
                 ,"");
      kj::_::Debug::Fault::fatal(&local_50);
    }
    if (value.dataSize == 1) {
      bVar2 = StructReader::getDataField<bool>(&value,0);
      if (!bVar2) {
        local_40 = 0;
      }
    }
    else {
      _end = StructReader::getDataSectionAsBlob(&value);
      ptr_1 = (WirePointer *)
              kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&end);
      while( true ) {
        pWVar4 = (WirePointer *)
                 kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&end);
        bVar2 = false;
        if (pWVar4 < ptr_1) {
          bVar2 = *(char *)((long)&ptr_1[-1].field_1 + 3) == '\0';
        }
        if (!bVar2) break;
        ptr_1 = (WirePointer *)((long)&ptr_1[-1].field_1.structRef.ptrCount.value + 1);
      }
      a = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&end);
      pVar5 = intervalLength<unsigned_char>(a,(uchar *)ptr_1,0x7fff8);
      local_40 = (ByteCount)pVar5;
    }
    _totalSize = value.pointers + (int)(uint)f.exception._6_2_;
    while( true ) {
      local_f1 = false;
      if (value.pointers < _totalSize) {
        local_f1 = WirePointer::isNull(_totalSize + -1);
      }
      if (local_f1 == false) break;
      _totalSize = _totalSize + -1;
    }
    pVar5 = intervalLength<capnp::_::WirePointer>(value.pointers,_totalSize,0xffff);
    f.exception._6_2_ = (StructPointerCount)pVar5;
  }
  WVar3 = roundBytesUpToWords(local_40);
  to = allocate((WirePointer **)&orphanArena_local,(SegmentBuilder **)&capTable_local,
                (CapTableBuilder *)ref_local,WVar3 + f.exception._6_2_,STRUCT,orphanArena);
  WirePointer::StructRef::set
            ((StructRef *)((long)&(orphanArena_local->super_Arena)._vptr_Arena + 4),
             (WordCount16)WVar3,f.exception._6_2_);
  if (value.dataSize == 1) {
    if (local_40 != 0) {
      bVar2 = StructReader::getDataField<bool>(&value,0);
      *(bool *)&to->content = bVar2;
    }
  }
  else {
    copyMemory((byte *)to,(byte *)value.data,local_40);
  }
  RStack_a4 = kj::zeroTo<unsigned_short>(f.exception._6_2_);
  ___end2 = &stack0xffffffffffffff5c;
  local_a6 = kj::Range<unsigned_short>::begin(___end2);
  local_a8 = kj::Range<unsigned_short>::end(___end2);
  while (bVar2 = kj::Range<unsigned_short>::Iterator::operator!=(&local_a6,&local_a8), bVar2) {
    puVar6 = kj::Range<unsigned_short>::Iterator::operator*(&local_a6);
    copyPointer((SegmentBuilder *)capTable_local,(CapTableBuilder *)ref_local,
                (WirePointer *)(to + (ulong)WVar3 + (long)(int)(uint)*puVar6),value.segment,
                value.capTable,value.pointers + (int)(uint)*puVar6,value.nestingLimit,
                (BuilderArena *)0x0,canonical);
    kj::Range<unsigned_short>::Iterator::operator++(&local_a6);
  }
  SVar1.value = to;
  SVar1.segment = (SegmentBuilder *)capTable_local;
  return SVar1;
}

Assistant:

static SegmentAnd<word*> setStructPointer(
      SegmentBuilder* segment, CapTableBuilder* capTable, WirePointer* ref, StructReader value,
      BuilderArena* orphanArena = nullptr, bool canonical = false) {
    auto dataSize = roundBitsUpToBytes(value.dataSize);
    auto ptrCount = value.pointerCount;

    if (canonical) {
      // StructReaders should not have bitwidths other than 1, but let's be safe
      KJ_REQUIRE((value.dataSize == ONE * BITS)
                 || (value.dataSize % BITS_PER_BYTE == ZERO * BITS));

      if (value.dataSize == ONE * BITS) {
        // Handle the truncation case where it's a false in a 1-bit struct
        if (!value.getDataField<bool>(ZERO * ELEMENTS)) {
          dataSize = ZERO * BYTES;
        }
      } else {
        // Truncate the data section
        auto data = value.getDataSectionAsBlob();
        auto end = data.end();
        while (end > data.begin() && end[-1] == 0) --end;
        dataSize = intervalLength(data.begin(), end, MAX_STUCT_DATA_WORDS * BYTES_PER_WORD);
      }

      // Truncate pointer section
      const WirePointer* ptr = value.pointers + ptrCount;
      while (ptr > value.pointers && ptr[-1].isNull()) --ptr;
      ptrCount = intervalLength(value.pointers, ptr, MAX_STRUCT_POINTER_COUNT);
    }

    auto dataWords = roundBytesUpToWords(dataSize);

    auto totalSize = dataWords + ptrCount * WORDS_PER_POINTER;

    word* ptr = allocate(ref, segment, capTable, totalSize, WirePointer::STRUCT, orphanArena);
    ref->structRef.set(dataWords, ptrCount);

    if (value.dataSize == ONE * BITS) {
      // Data size could be made 0 by truncation
      if (dataSize != ZERO * BYTES) {
        *reinterpret_cast<char*>(ptr) = value.getDataField<bool>(ZERO * ELEMENTS);
      }
    } else {
      copyMemory(reinterpret_cast<byte*>(ptr),
                 reinterpret_cast<const byte*>(value.data),
                 dataSize);
    }

    WirePointer* pointerSection = reinterpret_cast<WirePointer*>(ptr + dataWords);
    for (auto i: kj::zeroTo(ptrCount)) {
      copyPointer(segment, capTable, pointerSection + i,
                  value.segment, value.capTable, value.pointers + i,
                  value.nestingLimit, nullptr, canonical);
    }

    return { segment, ptr };
  }